

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall glslang::TIntermediate::promote(TIntermediate *this,TIntermOperator *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermOperator *node_local;
  TIntermediate *this_local;
  
  if (node == (TIntermOperator *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[8])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])();
        if (CONCAT44(extraout_var_03,iVar1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])();
          this_local._7_1_ =
               promoteAggregate(this,(TIntermAggregate *)CONCAT44(extraout_var_04,iVar1));
        }
      }
      else {
        iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[8])();
        this_local._7_1_ = promoteBinary(this,(TIntermBinary *)CONCAT44(extraout_var_02,iVar1));
      }
    }
    else {
      iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])();
      this_local._7_1_ = promoteUnary(this,(TIntermUnary *)CONCAT44(extraout_var_00,iVar1));
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::promote(TIntermOperator* node)
{
    if (node == nullptr)
        return false;

    if (node->getAsUnaryNode())
        return promoteUnary(*node->getAsUnaryNode());

    if (node->getAsBinaryNode())
        return promoteBinary(*node->getAsBinaryNode());

    if (node->getAsAggregate())
        return promoteAggregate(*node->getAsAggregate());

    return false;
}